

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O2

void modifyDeepChannels<float>
               (Array2D<unsigned_int> *sampleCount,
               list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>
               *channels,float delta)

{
  uint uVar1;
  long lVar2;
  uint *puVar3;
  _List_node_base *p_Var4;
  long lVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  uint32_t j;
  ulong uVar11;
  
  p_Var6 = (_List_node_base *)channels;
  while (p_Var6 = (((_List_base<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>
                     *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var6 != (_List_node_base *)channels) {
    p_Var7 = p_Var6[1]._M_next;
    if ((long)p_Var6[1]._M_next < 1) {
      p_Var7 = (_List_node_base *)0x0;
    }
    for (p_Var9 = (_List_node_base *)0x0; p_Var9 != p_Var7;
        p_Var9 = (_List_node_base *)((long)&p_Var9->_M_next + 1)) {
      lVar2 = sampleCount->_sizeY;
      puVar3 = sampleCount->_data;
      p_Var4 = p_Var6[1]._M_prev;
      p_Var10 = p_Var4;
      if ((long)p_Var4 < 1) {
        p_Var10 = (_List_node_base *)0x0;
      }
      for (p_Var8 = (_List_node_base *)0x0; p_Var8 != p_Var10;
          p_Var8 = (_List_node_base *)((long)&p_Var8->_M_next + 1)) {
        uVar1 = puVar3[(long)((long)&p_Var8->_M_next + lVar2 * (long)p_Var9)];
        for (uVar11 = 0; uVar1 != uVar11; uVar11 = uVar11 + 1) {
          lVar5 = *(long *)((long)p_Var6[2]._M_next +
                           (long)((long)&p_Var8->_M_next + (long)p_Var4 * (long)p_Var9) * 8);
          *(float *)(lVar5 + uVar11 * 4) = *(float *)(lVar5 + uVar11 * 4) + delta;
        }
      }
    }
  }
  return;
}

Assistant:

void
modifyDeepChannels (
    Array2D<uint32_t>& sampleCount, list<Array2D<T*>>& channels, T delta)
{
    //
    // Dummy code modifying each deep pixel by incrementing every sample of each channel by a given delta.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T*>& channel = *i;

        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                uint32_t count = sampleCount[y][x];
                for (uint32_t j = 0; j < count; j++)
                    channel[y][x][j] += delta;
            }
        }
    }
}